

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_portInstance_t * apx_nodeInstance_find_port_by_name(apx_nodeInstance_t *self,char *name)

{
  apx_portInstance_t *paVar1;
  int iVar2;
  char *pcVar3;
  char *port_name_1;
  apx_portInstance_t *port_instance_1;
  char *port_name;
  apx_portInstance_t *port_instance;
  apx_size_t port_id;
  char *name_local;
  apx_nodeInstance_t *self_local;
  
  if ((self != (apx_nodeInstance_t *)0x0) && (name != (char *)0x0)) {
    if (self->num_provide_ports != 0) {
      for (port_instance._4_4_ = 0; port_instance._4_4_ < self->num_provide_ports;
          port_instance._4_4_ = port_instance._4_4_ + 1) {
        paVar1 = self->provide_ports;
        pcVar3 = apx_portInstance_name(paVar1 + port_instance._4_4_);
        if ((pcVar3 != (char *)0x0) && (iVar2 = strcmp(pcVar3,name), iVar2 == 0)) {
          return paVar1 + port_instance._4_4_;
        }
      }
    }
    if (self->num_require_ports != 0) {
      for (port_instance._4_4_ = 0; port_instance._4_4_ < self->num_require_ports;
          port_instance._4_4_ = port_instance._4_4_ + 1) {
        paVar1 = self->require_ports;
        pcVar3 = apx_portInstance_name(paVar1 + port_instance._4_4_);
        if ((pcVar3 != (char *)0x0) && (iVar2 = strcmp(pcVar3,name), iVar2 == 0)) {
          return paVar1 + port_instance._4_4_;
        }
      }
    }
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t* apx_nodeInstance_find_port_by_name(apx_nodeInstance_t const* self, char const* name)
{
   if ((self != NULL) && (name != NULL))
   {
      apx_size_t port_id;
      if (self->num_provide_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_provide_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->provide_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
      if (self->num_require_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_require_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->require_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
   }
   return NULL;
}